

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c003::TestCheckCloseWithZeroEpsilonWorksForSameNumber::RunImpl
          (TestCheckCloseWithZeroEpsilonWorksForSameNumber *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  TestDetails local_90;
  int local_6c [5];
  TestDetails local_58;
  int local_34;
  float local_30;
  float local_2c;
  undefined1 local_28 [8];
  TestResults results;
  TestCheckCloseWithZeroEpsilonWorksForSameNumber *this_local;
  
  results._16_8_ = this;
  UnitTest::TestResults::TestResults((TestResults *)local_28,(TestReporter *)0x0);
  local_2c = 0.1;
  local_30 = 0.1;
  local_34 = 0;
  UnitTest::TestDetails::TestDetails(&local_58,"","","",0);
  UnitTest::CheckClose<float,float,int>
            ((TestResults *)local_28,&local_2c,&local_30,&local_34,&local_58);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  local_6c[1] = 0;
  local_6c[0] = UnitTest::TestResults::GetFailureCount((TestResults *)local_28);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_90,*ppTVar2,0x75);
  UnitTest::CheckEqual<int,int>(results_00,local_6c + 1,local_6c,&local_90);
  return;
}

Assistant:

TEST(CheckCloseWithZeroEpsilonWorksForSameNumber)
{
    TestResults results;
    CheckClose(results, 0.1f, 0.1f, 0, TestDetails("", "", "", 0));
    CHECK_EQUAL(0, results.GetFailureCount());
}